

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O3

size_t str_format(char *dst,size_t size,char *format,char **params,size_t nparams)

{
  char *__s1;
  int iVar1;
  char *__s;
  char *pcVar2;
  long lVar3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  size_t __n;
  ulong uVar8;
  size_t sVar9;
  bool bVar10;
  bool bVar11;
  
  if (*format == '\0') {
LAB_00106d57:
    sVar7 = 0;
  }
  else {
    sVar7 = 0;
    do {
      __s = strpbrk(format,"{\\");
      if (__s == (char *)0x0) {
        lVar3 = strlcpy(dst,format,size);
        return lVar3 + sVar7;
      }
      uVar6 = (long)__s - (long)format;
      if (size == 0) {
        if (*__s == '{') {
          size = 0;
          goto LAB_00106c39;
        }
        pcVar2 = __s + 1;
        if (__s[1] == '\0') {
          pcVar2 = __s;
        }
        size = 0;
LAB_00106d01:
        uVar8 = 1;
      }
      else {
        uVar5 = size - 1;
        if (uVar6 < size) {
          uVar5 = uVar6;
        }
        strlcpy(dst,format,uVar5 + 1);
        dst = dst + uVar5;
        size = size - uVar5;
        if (*__s != '{') {
          cVar4 = __s[1];
          pcVar2 = __s + 1;
          if (cVar4 == '\0') {
            pcVar2 = __s;
          }
          if (1 < size) {
            if (cVar4 == '\0') {
              cVar4 = *__s;
            }
            *dst = cVar4;
            dst = dst + 1;
            size = size - 1;
          }
          goto LAB_00106d01;
        }
LAB_00106c39:
        pcVar2 = strchr(__s,0x7d);
        if (pcVar2 == (char *)0x0) goto LAB_00106d57;
        __n = (long)pcVar2 - (long)(__s + 1);
        if (nparams != 0) {
          sVar9 = 0;
          do {
            __s1 = params[sVar9];
            iVar1 = strncmp(__s1,__s + 1,__n);
            if ((iVar1 == 0) && (__s1[__n] == '\0')) {
              uVar8 = strlcpy(dst,__s1 + __n + 1,size);
              uVar5 = size - 1;
              bVar10 = size < uVar8;
              size = size - uVar8;
              bVar11 = size != 0;
              if (bVar10) {
                size = 0;
              }
              if (!bVar10 && bVar11) {
                uVar5 = uVar8;
              }
              goto LAB_00106cd3;
            }
            sVar9 = sVar9 + 1;
          } while (nparams != sVar9);
        }
        uVar8 = __n + 2;
        uVar5 = size - 1;
        if (uVar8 < size) {
          uVar5 = uVar8;
        }
        strlcpy(dst,__s,uVar5 + 1);
        size = size - uVar5;
LAB_00106cd3:
        dst = dst + uVar5;
      }
      sVar7 = uVar6 + sVar7 + uVar8;
      format = pcVar2 + 1;
    } while (pcVar2[1] != '\0');
  }
  return sVar7;
}

Assistant:

size_t str_format(char *dst, size_t size, const char *format, const char *params[], size_t nparams)
{
    const char *pos, *copy = format;
    char *write = dst;

    size_t space = size;
    size_t space_needed = 0;

    for (pos = format; *pos; ++pos) {
        pos = strpbrk(pos, "{\\");
        if (!pos) {
            /* no more tokens, copy remainder of format string to output */
            space_needed += str_strlcpy(write, copy, space);
            break;
        }
        else {
            size_t bytes = pos - copy;
            /* found the start of a new token, copy `bytes` of lead text from [copy, pos) */
            space_needed += bytes;
            if (space > 0) {
                if (bytes >= space) {
                    bytes = space - 1;
                }
                str_strlcpy(write, copy, bytes + 1);
                write += bytes;
                space -= bytes;
            }
        }
        if (*pos == '{') {
            const char *token = pos + 1;

            copy = strchr(pos, '}');
            if (!copy) {
                /* syntax error: unterminated token */
                return 0;
            }
            else {
                /* found a token in the [token, copy) interval */
                size_t keylen = copy - token;
                size_t n;
                const char *val = NULL;
                for (n = 0; n != nparams; ++n) {
                    const char *key = params[n];
                    if (0 == strncmp(key, token, keylen)) {
                        /* param matches token? */
                        if (key[keylen] == '\0') {
                            val = key + keylen + 1;
                            break;
                        }
                    }
                }
                if (val) {
                    size_t slen = str_strlcpy(write, val, space);
                    space_needed += slen;
                    if (slen < space) {
                        space -= slen;
                        write += slen;
                    }
                    else {
                        /* buffer is full */
                        write += space - 1;
                        space = 0;
                    }
                }
                else {
                    /* token not found, copy [pos, copy] to output instead */
                    size_t bytes = keylen + 2;
                    space_needed += bytes;
                    if (bytes >= space) {
                        bytes = space - 1;
                    }
                    str_strlcpy(write, pos, bytes + 1);
                    write += bytes;
                    space -= bytes;
                }
                pos = copy++;
            }
        }
        else {
            /** backslash escapes the next character */
            ++space_needed;
            if (pos[1]) ++pos;
            if (space > 1) {
                *write++ = *pos;
                --space;
            }
            copy = pos + 1;
        }
    }
    if (copy < pos) {
        space_needed += str_strlcpy(write, copy, space);
    }
    return space_needed;
}